

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O1

ssize_t __thiscall Tag::read(Tag *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer *pppSVar1;
  iterator __position;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined7 extraout_var;
  ostream *poVar6;
  undefined4 extraout_var_00;
  pointer ppSVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 in_register_00000034;
  stringstream *f;
  int iVar10;
  long lVar11;
  ulong uVar12;
  string s;
  stringstream stream;
  undefined1 local_200 [36];
  int local_1dc;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  f = (stringstream *)CONCAT44(in_register_00000034,__fd);
  this->_numberOfLines = 0;
  bVar3 = getOpenTag(this,f);
  uVar9 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1dc = 0;
  do {
    if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) != 0) break;
    local_200._8_8_ = 0;
    local_200[0x10] = '\0';
    local_200._0_8_ = (StreamObject *)(local_200 + 0x10);
    std::operator>>((istream *)f,(string *)local_200);
    bVar3 = getCloseTag(this,(string *)local_200);
    if (bVar3) {
LAB_00106463:
      bVar2 = false;
    }
    else if (((*(char *)local_200._0_8_ == '<') &&
             (*(char *)(local_200._0_8_ + (local_200._8_8_ - 1)) == '>')) ||
            (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) != 0)) {
      std::__cxx11::stringbuf::str();
      bVar3 = true;
      if (local_200._8_8_ == local_1d8._M_string_length) {
        if (local_200._8_8_ == 0) {
          bVar3 = false;
        }
        else {
          iVar10 = bcmp((void *)local_200._0_8_,local_1d8._M_dataplus._M_p,local_200._8_8_);
          bVar3 = iVar10 != 0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Syntax error: \"</",0x11);
        StreamObject::getName_abi_cxx11_(&local_1d8,&this->super_StreamObject);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1d8._M_dataplus._M_p,
                            local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,">\" missing.",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        uVar9 = 0;
        goto LAB_00106463;
      }
    }
    else {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_200._0_8_,local_200._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_1dc = local_1dc + 1;
      bVar2 = true;
    }
    if ((StreamObject *)local_200._0_8_ != (StreamObject *)(local_200 + 0x10)) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_200._17_7_,local_200[0x10]) + 1);
    }
  } while (bVar2);
  if ((uVar9 & 1) != 0) {
    if (local_1dc % this->_lineSize == 0) {
      this->_numberOfLines = local_1dc / this->_lineSize;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Syntax error: wrong number of elements in \"<",0x2c);
      StreamObject::getName_abi_cxx11_((string *)local_200,&this->super_StreamObject);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_200._0_8_,local_200._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,">\"-Tag.",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((StreamObject *)local_200._0_8_ != (StreamObject *)(local_200 + 0x10)) {
        operator_delete((void *)local_200._0_8_,CONCAT71(local_200._17_7_,local_200[0x10]) + 1);
      }
      uVar9 = 0;
    }
  }
  if ((uVar9 & 1) != 0) {
    if (1 < this->_numberOfLines) {
      iVar10 = 1;
      do {
        if (0 < this->_lineSize) {
          lVar11 = 0;
          do {
            iVar4 = (*(this->_streamObjects).
                      super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11]->_vptr_StreamObject[2])();
            local_200._0_8_ = CONCAT44(extraout_var_00,iVar4);
            StreamObject::setOffset
                      ((StreamObject *)local_200._0_8_,this->_lineSize * iVar10 + (int)lVar11);
            __position._M_current =
                 (this->_streamObjects).
                 super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->_streamObjects).
                super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<StreamObject*,std::allocator<StreamObject*>>::
              _M_realloc_insert<StreamObject*const&>
                        ((vector<StreamObject*,std::allocator<StreamObject*>> *)
                         &this->_streamObjects,__position,(StreamObject **)local_200);
            }
            else {
              *__position._M_current = (StreamObject *)local_200._0_8_;
              pppSVar1 = &(this->_streamObjects).
                          super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppSVar1 = *pppSVar1 + 1;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < this->_lineSize);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < this->_numberOfLines);
    }
    ppSVar7 = (this->_streamObjects).
              super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->_streamObjects).super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppSVar7) {
      uVar8 = 0;
      uVar12 = 1;
      do {
        if ((uVar9 & 1) == 0) break;
        uVar5 = (*ppSVar7[uVar8]->_vptr_StreamObject[1])(ppSVar7[uVar8],local_1b8);
        uVar9 = (ulong)uVar5;
        ppSVar7 = (this->_streamObjects).
                  super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar3 = uVar12 < (ulong)((long)(this->_streamObjects).
                                       super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >>
                                3);
        uVar8 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar3);
    }
  }
  if ((uVar9 & 1) != 0) {
    uVar5 = (*(this->super_StreamObject)._vptr_StreamObject[3])(this);
    uVar9 = (ulong)uVar5;
  }
  if ((uVar9 & 1) != 0) {
    Object::setInitState(&(this->super_StreamObject).super_Object,true);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return uVar9 & 0xffffffffffffff01;
}

Assistant:

bool Tag::read( std::stringstream &f )
{
	bool success = true;

	_numberOfLines = 0;

	success = getOpenTag( f );

	int numberOfElements = 0;

	std::stringstream stream;

	while ( ! f.eof() )
	{
		std::string s;
		f >> s;
		if ( getCloseTag( s ) )
		{
			break;
		}
		else
		{
			if (( s[0] == '<' ) && ( s[s.size()-1] == '>' ) || f.eof() )
			{
				if ( s != stream.str() )
				{
					std::cerr << "Syntax error: \"</" << getName() << ">\" missing." << std::endl;
					success = false;
					break;
				}
			}
			else
			{
				stream << s << std::endl;
				numberOfElements++;
			}
		}
	}

	if ( success )
	{
		if ( numberOfElements % lineSize() == 0 )
		{
			_numberOfLines = numberOfElements / lineSize();
		}
		else
		{
			std::cerr << "Syntax error: wrong number of elements in \"<" << getName() << ">\"-Tag." << std::endl;
			success = false;
		}
	}

	if ( success )
	{

		int offset = 0;

		for ( int j = 1; j < _numberOfLines; j++ )
		{
			for ( int i = 0; i < lineSize();i++ )
			{
				StreamObject *obj = elements()[i]->getInstance();

				offset = lineSize() * j;

				obj->setOffset( offset + i );

				elements().push_back( obj );
			}
		}

		for ( unsigned int i = 0; i < elements().size(); i++ )
		{
			if ( success )
			{
				success = _streamObjects[i]->read( stream );
			}
			else
			{
				break;
			}
		}
	}

	if ( success )
	{
		success = verify();
	}

	if ( success )
	{
		setInitState( true );
	}

	return success;
}